

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O2

void result_tests::ExpectSuccess<result_tests::NoCopy,int>
               (Result<result_tests::NoCopy> *result,bilingual_str *str,int *args)

{
  T *pTVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  __uniq_ptr_impl<int,_std::default_delete<int>_> *p_Var3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  T *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  __uniq_ptr_impl<int,_std::default_delete<int>_> local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ExpectResult<result_tests::NoCopy>(result,true,str);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x41;
  file.m_begin = (iterator)&local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_80 = "";
  p_Var3 = &local_c0;
  local_c0._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl._0_1_ =
       *(__index_type *)
        ((long)&(result->m_variant).super__Variant_base<bilingual_str,_result_tests::NoCopy>.
                super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
                super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
                super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x40) == '\x01';
  local_f8 = (T *)CONCAT71(local_f8._1_7_,1);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_78,&local_88,0x41,1,2,p_Var3,"result.has_value()",&local_f8,"true");
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)p_Var3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x42;
  file_00.m_begin = (iterator)&local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_a8,msg_00
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_b0 = "";
  pTVar1 = util::Result<result_tests::NoCopy>::value(result);
  NoCopy::NoCopy((NoCopy *)&local_c0,*args);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,result_tests::NoCopy,result_tests::NoCopy>
            (&local_78,&local_b8,0x42,1,2,pTVar1,"result.value()",&local_c0,
             "T{std::forward<Args>(args)...}");
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)&local_c0);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pTVar1;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e0,msg_01
            );
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_01139f30;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_e8 = "";
  local_c0._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int>_>)util::Result<result_tests::NoCopy>::value(result);
  local_f8 = util::Result<result_tests::NoCopy>::value(result);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,result_tests::NoCopy_const*,result_tests::NoCopy_const*>
            (&local_78,&local_f0,0x43,1,2,&local_c0,"&result.value()",&local_f8,"&*result");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpectSuccess(const util::Result<T>& result, const bilingual_str& str, Args&&... args)
{
    ExpectResult(result, true, str);
    BOOST_CHECK_EQUAL(result.has_value(), true);
    BOOST_CHECK_EQUAL(result.value(), T{std::forward<Args>(args)...});
    BOOST_CHECK_EQUAL(&result.value(), &*result);
}